

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.h
# Opt level: O0

bool is_valid_index_type(uint32_t type)

{
  uint32_t type_local;
  bool local_1;
  
  switch(type) {
  case 1:
  case 2:
  case 3:
  case 4:
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

constexpr bool is_valid_index_type(uint32_t type) {
    // Be careful here. This looks complex, but avoids undefined behaviour.
    switch (static_cast<IndexType>(type)) {
        case IndexType::GRAM3:
            [[fallthrough]];
        case IndexType::TEXT4:
            [[fallthrough]];
        case IndexType::HASH4:
            [[fallthrough]];
        case IndexType::WIDE8:
            return true;
    }
    return false;
}